

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O1

int Test_SUNLinSolSolve(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype tol,int myid)

{
  uint uVar1;
  int iVar2;
  N_Vector z;
  
  z = N_VClone(x);
  N_VConst(0.0,z);
  uVar1 = SUNLinSolSolve(S,A,z,b,tol);
  if (uVar1 != 0) {
    printf(">>> FAILED test -- SUNLinSolSolve returned %d on Proc %d \n",(ulong)uVar1,
           (ulong)(uint)myid);
  }
  if ((int)uVar1 < 0) {
    iVar2 = 1;
  }
  else {
    iVar2 = check_vector(x,z,tol * 10.0);
    N_VScale(1.0,z,x);
    if (iVar2 == 0) {
      iVar2 = 0;
      if (myid != 0) goto LAB_00103531;
      puts("    PASSED test -- SUNLinSolSolve ");
      iVar2 = 0;
    }
    else {
      printf(">>> FAILED test -- SUNLinSolSolve check, Proc %d \n",(ulong)(uint)myid);
      iVar2 = 1;
    }
    if (print_time != 0) {
      printf("    SUNLinSolSolve Time: %22.15e \n \n",0);
    }
  }
LAB_00103531:
  N_VDestroy(z);
  return iVar2;
}

Assistant:

int Test_SUNLinSolSolve(SUNLinearSolver S, SUNMatrix A, N_Vector x, 
                        N_Vector b, realtype tol, int myid)
{
  int       failure;
  double    start_time, stop_time;
  N_Vector  y;

  /* clone to create solution vector */
  y = N_VClone(x);
  N_VConst(ZERO, y);

  /* perform solve */
  start_time = get_time();
  failure = SUNLinSolSolve(S, A, y, b, tol);
  stop_time = get_time(); 
  if (failure) {
    printf(">>> FAILED test -- SUNLinSolSolve returned %d on Proc %d \n", 
           failure, myid);
  }
  if (failure < 0) {
    N_VDestroy(y);
    return(1);
  }

  /* Check solution, and copy y into x for return */
  failure = check_vector(x, y, 10.0*tol);
  N_VScale(ONE, y, x);
  if (failure) {
    printf(">>> FAILED test -- SUNLinSolSolve check, Proc %d \n", myid);
    PRINT_TIME("    SUNLinSolSolve Time: %22.15e \n \n", stop_time - start_time);
    N_VDestroy(y);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolSolve \n");
    PRINT_TIME("    SUNLinSolSolve Time: %22.15e \n \n", stop_time - start_time);
  }    

  N_VDestroy(y);
  return(0);
}